

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deriv.c
# Opt level: O0

void solv_diffeq(Item *qsol,Symbol *fun,Symbol *method,int numeqn,int listnum,int steadystate,
                int btype)

{
  int iVar1;
  int iVar2;
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  Item *in_RDI;
  uint in_R8D;
  int in_R9D;
  int found;
  Item *q;
  char ssprefix [8];
  char dindepname [50];
  char *maxerr_str;
  undefined4 in_stack_ffffffffffffff28;
  uint uVar3;
  undefined4 in_stack_ffffffffffffff2c;
  List *in_stack_ffffffffffffff30;
  List *pLVar4;
  Item *pIVar5;
  char *in_stack_ffffffffffffff38;
  undefined4 uVar6;
  char *in_stack_ffffffffffffff40;
  undefined4 uVar8;
  char *pcVar7;
  char *in_stack_ffffffffffffff48;
  undefined4 uVar10;
  undefined8 uVar9;
  Symbol *in_stack_ffffffffffffff50;
  undefined4 uVar12;
  char *pcVar11;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff68;
  Symbol *in_stack_ffffffffffffff70;
  char local_88 [56];
  char *local_50;
  int local_44;
  uint local_40;
  uint local_3c;
  long local_38;
  long local_30;
  Item *local_28;
  
  local_44 = in_R9D;
  local_40 = in_R8D;
  local_3c = in_ECX;
  local_38 = in_RDX;
  local_30 = in_RSI;
  local_28 = in_RDI;
  if ((in_RDX == 0) || (iVar1 = strcmp(*(char **)(in_RDX + 0x48),"cnexp"), iVar1 != 0)) {
    if (local_44 == 0) {
      strcpy(&stack0xffffffffffffff70,"");
    }
    else {
      strcpy(&stack0xffffffffffffff70,"_ss_");
    }
    sprintf(local_88,"d%s",indepsym->name);
    if ((*(ulong *)(local_30 + 8) & 0x400) != 0) {
      if ((*(ulong *)(local_38 + 8) & 0x200) == 0) {
        kinetic_implicit(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                         (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      }
      else {
        kinetic_intmethod(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      }
    }
    save_dt(local_28);
    uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff50 >> 0x20);
    if ((*(ulong *)(local_38 + 8) & 0x200) == 0) {
      pLVar4 = (List *)CONCAT44((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),local_40);
      uVar3 = local_3c;
      sprintf(buf,
              "  if (!_thread[_spth%d]._pvoid) {\n    _thread[_spth%d]._pvoid = nrn_cons_sparseobj(%s%s{}, %d, _ml, _threadargs_);\n    #ifdef _OPENACC\n    if (_nt->compute_gpu) {\n      void* _d_so = cnrn_target_deviceptr(_thread[_spth%d]._pvoid);\n      ThreadDatum* _d_td = cnrn_target_deviceptr(_thread);\n      cnrn_target_memcpy_to_device(&(_d_td[_spth%d]._pvoid), &_d_so);\n    }\n    #endif\n  }\n"
              ,(ulong)local_40,(ulong)local_40,*(undefined8 *)(local_30 + 0x48),suffix,local_3c,
              pLVar4,CONCAT44((int)((ulong)in_stack_ffffffffffffff38 >> 0x20),local_40));
      lappendstr(pLVar4,(char *)CONCAT44(in_stack_ffffffffffffff2c,uVar3));
      pcVar7 = local_88;
      uVar9 = *(undefined8 *)(local_30 + 0x48);
      pIVar5 = (Item *)CONCAT44((int)((ulong)pLVar4 >> 0x20),local_40);
      pcVar11 = (char *)CONCAT44(uVar6,local_40);
      uVar3 = local_40;
      sprintf(buf,
              "%s%s(&_sparseobj%d, %d, _slist%d, _dlist%d, _p, &%s, %s, %s,&_coef%d, _linmat%d);\n",
              &stack0xffffffffffffff70,*(undefined8 *)(local_38 + 0x48),(ulong)local_40,
              (ulong)local_3c,local_40,pIVar5,indepsym->name,pcVar7,uVar9,pcVar11,local_40);
    }
    else {
      if (*(int *)(local_38 + 0x28) == 1) {
        local_50 = ", maxerr";
        ifnew_parminstall(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                          (char *)in_stack_ffffffffffffff30,
                          (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      }
      else {
        local_50 = "";
      }
      uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff48 >> 0x20);
      if (deriv_imp_list != (List *)0x0) {
        iVar1 = 0;
        pIVar5 = deriv_imp_list->next;
        while( true ) {
          uVar12 = (undefined4)((ulong)in_stack_ffffffffffffff50 >> 0x20);
          uVar10 = (undefined4)((ulong)in_stack_ffffffffffffff48 >> 0x20);
          uVar8 = (undefined4)((ulong)in_stack_ffffffffffffff40 >> 0x20);
          uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20);
          if (pIVar5 == deriv_imp_list) break;
          iVar2 = strcmp((pIVar5->element).str,*(char **)(local_30 + 0x48));
          if (iVar2 == 0) {
            iVar1 = 1;
          }
          pIVar5 = pIVar5->next;
        }
        iVar2 = strcmp(*(char **)(local_38 + 0x48),Derivimplicit);
        if ((iVar2 == 0) != (iVar1 == 1)) {
          diag((char *)in_stack_ffffffffffffff30,
               (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        }
        derivimplic_listnum = local_40;
        sprintf(buf,"static int _deriv%d_advance = 1;\n",(ulong)local_40);
        linsertstr(in_stack_ffffffffffffff30,
                   (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        pLVar4 = (List *)CONCAT44((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                                  thread_data_index + 2);
        uVar3 = local_40;
        sprintf(buf,
                "\n#define _deriv%d_advance _thread[%d]._i\n#define _dith%d %d\n#define _newtonspace%d _thread[%d]._pvoid\n"
                ,(ulong)local_40,(ulong)(uint)thread_data_index,(ulong)local_40,
                (ulong)(thread_data_index + 1));
        vectorize_substitute(pLVar4,(char *)CONCAT44(in_stack_ffffffffffffff2c,uVar3));
        sprintf(buf,"  _thread[_dith%d]._pval = NULL;",(ulong)local_40);
        lappendstr(pLVar4,(char *)CONCAT44(in_stack_ffffffffffffff2c,uVar3));
        pLVar4 = (List *)CONCAT44((int)((ulong)pLVar4 >> 0x20),local_40);
        uVar9 = CONCAT44(uVar10,thread_data_index + 2);
        uVar3 = local_3c;
        sprintf(buf,
                "  if (!_newtonspace%d) {\n    _newtonspace%d = nrn_cons_newtonspace(%d, _cntml_padded);\n    _thread[_dith%d]._pval = makevector(2*%d*_cntml_padded*sizeof(double));\n    #ifdef _OPENACC\n    if (_nt->compute_gpu) {\n      void* _d_ns = cnrn_target_deviceptr(_newtonspace%d);\n      double* _d_pd = cnrn_target_copyin(_thread[_dith%d]._pval, 2*%d*_cntml_padded);\n      ThreadDatum* _d_td = cnrn_target_deviceptr(_thread);\n      cnrn_target_memcpy_to_device(&(_d_td[%d]._pvoid), &_d_ns);\n      cnrn_target_memcpy_to_device(&(_d_td[_dith%d]._pval), &_d_pd);\n    }\n    #endif\n  }\n"
                ,(ulong)local_40,(ulong)local_40,(ulong)local_3c,(ulong)local_40,local_3c,pLVar4,
                CONCAT44(uVar6,local_40),CONCAT44(uVar8,local_3c),uVar9,CONCAT44(uVar12,local_40));
        uVar6 = (undefined4)((ulong)uVar9 >> 0x20);
        lappendstr(pLVar4,(char *)CONCAT44(in_stack_ffffffffffffff2c,uVar3));
        sprintf(buf,"  free( _thread[_dith%d]._pval);\n",(ulong)local_40);
        lappendstr(pLVar4,(char *)CONCAT44(in_stack_ffffffffffffff2c,uVar3));
        sprintf(buf,"  nrn_destroy_newtonspace((NewtonSpace*) _newtonspace%d);\n",(ulong)local_40);
        lappendstr(pLVar4,(char *)CONCAT44(in_stack_ffffffffffffff2c,uVar3));
        thread_data_index = thread_data_index + 3;
      }
      pIVar5 = (Item *)indepsym->name;
      pcVar7 = *(char **)(local_30 + 0x48);
      uVar9 = CONCAT44(uVar6,local_40);
      uVar3 = local_40;
      pcVar11 = local_50;
      sprintf(buf," %s%s(_ninits, %d, _slist%d, _dlist%d, _p, &%s, %s, %s, &_temp%d%s);",
              &stack0xffffffffffffff70,*(undefined8 *)(local_38 + 0x48),(ulong)local_3c,
              (ulong)local_40,local_40,pIVar5,local_88,pcVar7,uVar9,local_50);
    }
    replacstr(pIVar5,(char *)CONCAT44(in_stack_ffffffffffffff2c,uVar3));
    if ((*(ulong *)(local_38 + 8) & 0x200) == 0) {
      if (vectorize != 0) {
        pIVar5 = (Item *)CONCAT44((int)((ulong)pIVar5 >> 0x20),local_40);
        sprintf(buf,
                "\n  %s%s_thread(static_cast<SparseObj*>(_thread[_spth%d]._pvoid), %d, _slist%d, _dlist%d, &%s, %s, %s%s<coreneuron::scopmath::enabled_code::compute_only>{}, _linmat%d, _threadargs_);\n"
                ,&stack0xffffffffffffff70,*(undefined8 *)(local_38 + 0x48),(ulong)local_40,
                (ulong)local_3c,local_40,pIVar5,indepsym->name,local_88,
                *(undefined8 *)(local_30 + 0x48),suffix,local_40);
        vectorize_substitute(pIVar5,(char *)CONCAT44(in_stack_ffffffffffffff2c,local_40));
      }
    }
    else {
      pIVar5 = *(Item **)(local_30 + 0x48);
      sprintf(buf,"\n  %s%s_thread(%d, _slist%d, _dlist%d, %s%s{}, _threadargs_);\n",
              &stack0xffffffffffffff70,*(undefined8 *)(local_38 + 0x48),(ulong)local_3c,
              (ulong)local_40,local_40,pIVar5,suffix,pcVar7,uVar9,pcVar11);
      vectorize_substitute(pIVar5,(char *)CONCAT44(in_stack_ffffffffffffff2c,local_40));
    }
  }
  else {
    sprintf(buf," %s();\n",*(undefined8 *)(local_30 + 0x48));
    replacstr(in_stack_ffffffffffffff30,
              (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    sprintf(buf," %s(_threadargs_);\n",*(undefined8 *)(local_30 + 0x48));
    vectorize_substitute
              (in_stack_ffffffffffffff30,
               (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  }
  return;
}

Assistant:

void solv_diffeq(qsol, fun, method, numeqn, listnum, steadystate, btype)
	Item *qsol;
	Symbol *fun, *method;
	int numeqn, listnum, steadystate;
	int btype;
{
	char *maxerr_str, dindepname[50];
	char ssprefix[8];
	
	if (method && strcmp(method->name, "cnexp") == 0) {
		sprintf(buf, " %s();\n", fun->name);
		replacstr(qsol, buf);
		sprintf(buf, " %s(_threadargs_);\n", fun->name);
		vectorize_substitute(qsol, buf); 
		return;
	}
	if (steadystate) {
		Strcpy(ssprefix, "_ss_");
	}else{
		Strcpy(ssprefix, "");
	}
	Sprintf(dindepname, "d%s", indepsym->name);
	if (fun->subtype & KINF) { /* translate the kinetic equations */
		/* can be standard integrator, full matrix advancec, or
		   sparse matrix advance */
		/* at this time only sparse and standard exists */
		if (method->subtype & DERF) {
			kinetic_intmethod(fun, method->name);
		} else {
			kinetic_implicit(fun, dindepname, method->name);
		}
	}
	save_dt(qsol);
	if (method->subtype & DERF) {
		if (method->u.i == 1) { /* variable step method */
			maxerr_str = ", maxerr";
			IGNORE(ifnew_parminstall("maxerr", "1e-5", "", ""));
		} else {
			maxerr_str = "";
		}

if (deriv_imp_list) {	/* make sure deriv block translation matches method */
	Item *q; int found=0;
	ITERATE(q, deriv_imp_list) {
		if (strcmp(STR(q), fun->name) == 0) {
			found = 1;
		}
	}
	if ((strcmp(method->name, Derivimplicit) == 0) ^ (found == 1)) {
	diag("To use the derivimplicit method the SOLVE statement must\
 precede the DERIVATIVE block\n",
" and all SOLVEs using that block must use the derivimplicit method\n");
	}
	derivimplic_listnum = listnum;	
	Sprintf(buf, "static int _deriv%d_advance = 1;\n", listnum);
	q = linsertstr(procfunc, buf);
	Sprintf(buf, "\n#define _deriv%d_advance _thread[%d]._i\n\
#define _dith%d %d\n#define _newtonspace%d _thread[%d]._pvoid\n\
", listnum, thread_data_index, listnum, thread_data_index+1, listnum, thread_data_index+2);

	vectorize_substitute(q, buf);
	Sprintf(buf, "  _thread[_dith%d]._pval = NULL;", listnum);
	lappendstr(thread_mem_init_list, buf);
	Sprintf(buf,
          "  if (!_newtonspace%d) {\n"
          "    _newtonspace%d = nrn_cons_newtonspace(%d, _cntml_padded);\n"
          "    _thread[_dith%d]._pval = makevector(2*%d*_cntml_padded*sizeof(double));\n"
	  "    #ifdef _OPENACC\n"
	  "    if (_nt->compute_gpu) {\n"
	  "      void* _d_ns = cnrn_target_deviceptr(_newtonspace%d);\n"
	  "      double* _d_pd = cnrn_target_copyin(_thread[_dith%d]._pval, 2*%d*_cntml_padded);\n"
	  "      ThreadDatum* _d_td = cnrn_target_deviceptr(_thread);\n"
	  "      cnrn_target_memcpy_to_device(&(_d_td[%d]._pvoid), &_d_ns);\n"
	  "      cnrn_target_memcpy_to_device(&(_d_td[_dith%d]._pval), &_d_pd);\n"
	  "    }\n"
	  "    #endif\n"
          "  }\n"
          , listnum, listnum, numeqn, listnum, numeqn
	  , listnum, listnum, numeqn, thread_data_index+2, listnum
	  );
	lappendstr(newtonspace_list, buf);
	Sprintf(buf, "  free( _thread[_dith%d]._pval);\n", listnum);
	lappendstr(thread_cleanup_list, buf);
	Sprintf(buf, "  nrn_destroy_newtonspace((NewtonSpace*) _newtonspace%d);\n", listnum);
	lappendstr(thread_cleanup_list, buf);
	thread_data_index += 3;
}
Sprintf(buf," %s%s(_ninits, %d, _slist%d, _dlist%d, _p, &%s, %s, %s, &_temp%d%s);",
ssprefix,
method->name, numeqn, listnum, listnum, indepsym->name, dindepname,
fun->name, listnum, maxerr_str);
	}else{
	  Sprintf(buf,
	    "  if (!_thread[_spth%d]._pvoid) {\n"
	    "    _thread[_spth%d]._pvoid = nrn_cons_sparseobj(%s%s{}, %d, _ml, _threadargs_);\n"
	    "    #ifdef _OPENACC\n"
	    "    if (_nt->compute_gpu) {\n"
	    "      void* _d_so = cnrn_target_deviceptr(_thread[_spth%d]._pvoid);\n"
	    "      ThreadDatum* _d_td = cnrn_target_deviceptr(_thread);\n"
	    "      cnrn_target_memcpy_to_device(&(_d_td[_spth%d]._pvoid), &_d_so);\n"
	    "    }\n"
	    "    #endif\n"
	    "  }\n"
	    , listnum, listnum, fun->name, suffix, numeqn
	    , listnum, listnum
	    );
	  lappendstr(newtonspace_list, buf);
Sprintf(buf, "%s%s(&_sparseobj%d, %d, _slist%d, _dlist%d, _p, &%s, %s, %s\
,&_coef%d, _linmat%d);\n",
ssprefix, method->name, listnum, numeqn, listnum, listnum, indepsym->name,
dindepname, fun->name, listnum, listnum);
	}
	replacstr(qsol, buf);
#if VECTORIZE
	if (method->subtype & DERF) { /* derivimplicit */
	Sprintf(buf, "\n  %s%s_thread(%d, _slist%d, _dlist%d, %s%s{}, _threadargs_);\n",
		ssprefix, method->name, numeqn, listnum, listnum, fun->name, suffix);
	vectorize_substitute(qsol, buf);
	}else{ /* kinetic */
   if (vectorize) {
Sprintf(buf,
"\n  %s%s_thread(static_cast<SparseObj*>(_thread[_spth%d]._pvoid), %d, _slist%d, _dlist%d, &%s, %s, %s%s<coreneuron::scopmath::enabled_code::compute_only>{}, _linmat%d, _threadargs_);\n",
ssprefix, method->name, listnum, numeqn, listnum, listnum, indepsym->name,
dindepname, fun->name, suffix, listnum);
	vectorize_substitute(qsol, buf);
   }
#endif
	}
}